

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O0

Abc_Obj_t * Abc_NtkCovDerive_rec(Cov_Man_t *p,Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  Mem_Flex_t *pMan;
  char Type_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Min_Cube_t *pCover_00;
  Min_Cube_t *pCover_01;
  Abc_Obj_t *pAVar3;
  Vec_Str_t *vCover_00;
  char *pcVar4;
  int Type;
  int nCubes;
  int Entry;
  int i;
  Vec_Str_t *vCover;
  Vec_Int_t *vSupp;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNodeNew;
  Min_Cube_t *pCovers [3];
  Min_Cube_t *local_38;
  Min_Cube_t *pCover;
  int fVerbose;
  Abc_Obj_t *pObj_local;
  Abc_Ntk_t *pNtkNew_local;
  Cov_Man_t *p_local;
  
  if ((pObj->field_6).pTemp != (void *)0x0) {
    return (pObj->field_6).pCopy;
  }
  iVar1 = Abc_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covBuild.c"
                  ,0x197,"Abc_Obj_t *Abc_NtkCovDerive_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *)");
  }
  p_00 = Abc_ObjGetSupp(pObj);
  if (p_00 == (Vec_Int_t *)0x0) {
    __assert_fail("vSupp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covBuild.c"
                  ,0x19a,"Abc_Obj_t *Abc_NtkCovDerive_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pCover_00 = Abc_ObjGetCover(pObj,0);
  pCover_01 = Abc_ObjGetCover(pObj,1);
  local_38 = Abc_ObjGetCover2(pObj);
  if (pCover_00 != (Min_Cube_t *)0x0) {
    if (pCover_01 != (Min_Cube_t *)0x0) {
      iVar1 = Min_CoverCountCubes(pCover_00);
      iVar2 = Min_CoverCountCubes(pCover_01);
      if (iVar2 < iVar1) goto LAB_0048accd;
    }
    if (local_38 != (Min_Cube_t *)0x0) {
      iVar1 = Min_CoverCountCubes(pCover_00);
      iVar2 = Min_CoverCountCubes(local_38);
      if (iVar2 < iVar1) goto LAB_0048accd;
    }
    Type_00 = '1';
    local_38 = pCover_00;
    goto LAB_0048adcf;
  }
LAB_0048accd:
  if (pCover_01 == (Min_Cube_t *)0x0) {
LAB_0048ad3e:
    if (local_38 == (Min_Cube_t *)0x0) {
LAB_0048adac:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covBuild.c"
                    ,0x1ba,"Abc_Obj_t *Abc_NtkCovDerive_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *)")
      ;
    }
    if (pCover_00 != (Min_Cube_t *)0x0) {
      iVar1 = Min_CoverCountCubes(local_38);
      iVar2 = Min_CoverCountCubes(pCover_00);
      if (iVar2 <= iVar1) goto LAB_0048adac;
    }
    if (pCover_01 != (Min_Cube_t *)0x0) {
      iVar1 = Min_CoverCountCubes(local_38);
      iVar2 = Min_CoverCountCubes(pCover_01);
      if (iVar2 <= iVar1) goto LAB_0048adac;
    }
    Type_00 = 'x';
  }
  else {
    if (pCover_00 != (Min_Cube_t *)0x0) {
      iVar1 = Min_CoverCountCubes(pCover_01);
      iVar2 = Min_CoverCountCubes(pCover_00);
      if (iVar2 < iVar1) goto LAB_0048ad3e;
    }
    if (local_38 != (Min_Cube_t *)0x0) {
      iVar1 = Min_CoverCountCubes(pCover_01);
      iVar2 = Min_CoverCountCubes(local_38);
      if (iVar2 < iVar1) goto LAB_0048ad3e;
    }
    Type_00 = '0';
    local_38 = pCover_01;
  }
LAB_0048adcf:
  for (nCubes = 0; iVar1 = Vec_IntSize(p_00), nCubes < iVar1; nCubes = nCubes + 1) {
    iVar1 = Vec_IntEntry(p_00,nCubes);
    pAVar3 = Abc_NtkObj(pObj->pNtk,iVar1);
    Abc_NtkCovDerive_rec(p,pNtkNew,pAVar3);
  }
  iVar1 = Min_CoverCountCubes(local_38);
  if (iVar1 == 0) {
    pFanin = Abc_NtkCreateNodeConst0(pNtkNew);
  }
  else if (iVar1 == 1) {
    pFanin = Abc_NtkCovDeriveCube(pNtkNew,pObj,local_38,p_00,(uint)(Type_00 == '0'));
  }
  else {
    pFanin = Abc_NtkCreateNode(pNtkNew);
    for (nCubes = 0; iVar1 = Vec_IntSize(p_00), nCubes < iVar1; nCubes = nCubes + 1) {
      iVar1 = Vec_IntEntry(p_00,nCubes);
      pAVar3 = Abc_NtkObj(pObj->pNtk,iVar1);
      Abc_ObjAddFanin(pFanin,(pAVar3->field_6).pCopy);
    }
    vCover_00 = Vec_StrAlloc(100);
    Min_CoverCreate(vCover_00,local_38,Type_00);
    pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
    pcVar4 = Vec_StrArray(vCover_00);
    pcVar4 = Abc_SopRegister(pMan,pcVar4);
    (pFanin->field_5).pData = pcVar4;
    Vec_StrFree(vCover_00);
  }
  (pObj->field_6).pCopy = pFanin;
  return pFanin;
}

Assistant:

Abc_Obj_t * Abc_NtkCovDerive_rec( Cov_Man_t * p, Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    int fVerbose = 0;
    Min_Cube_t * pCover, * pCovers[3];
    Abc_Obj_t * pNodeNew, * pFanin;
    Vec_Int_t * vSupp;
    Vec_Str_t * vCover;
    int i, Entry, nCubes, Type;
    // skip if already computed
    if ( pObj->pCopy )
        return pObj->pCopy;
    assert( Abc_ObjIsNode(pObj) );
    // get the support and the cover
    vSupp  = Abc_ObjGetSupp( pObj ); 
    assert( vSupp );
    // choose the cover to implement
    pCovers[0] = Abc_ObjGetCover( pObj, 0 );
    pCovers[1] = Abc_ObjGetCover( pObj, 1 );
    pCovers[2] = Abc_ObjGetCover2( pObj );
    // use positive polarity
    if ( pCovers[0] 
        && (!pCovers[1] || Min_CoverCountCubes(pCovers[0]) <= Min_CoverCountCubes(pCovers[1]))
        && (!pCovers[2] || Min_CoverCountCubes(pCovers[0]) <= Min_CoverCountCubes(pCovers[2]))   )
    {
        pCover = pCovers[0];
        Type = '1';
    }
    else 
    // use negative polarity
    if ( pCovers[1] 
        && (!pCovers[0] || Min_CoverCountCubes(pCovers[1]) <= Min_CoverCountCubes(pCovers[0]))
        && (!pCovers[2] || Min_CoverCountCubes(pCovers[1]) <= Min_CoverCountCubes(pCovers[2]))   )
    {
        pCover = pCovers[1];
        Type = '0';
    }
    else 
    // use XOR polarity
    if ( pCovers[2] 
        && (!pCovers[0] || Min_CoverCountCubes(pCovers[2]) < Min_CoverCountCubes(pCovers[0]))
        && (!pCovers[1] || Min_CoverCountCubes(pCovers[2]) < Min_CoverCountCubes(pCovers[1]))   )
    {
        pCover = pCovers[2];
        Type = 'x';
    }
    else
        assert( 0 );
    // print the support of this node
    if ( fVerbose )
    {
        printf( "{ " );
        Vec_IntForEachEntry( vSupp, Entry, i )
            printf( "%d ", Entry );
        printf( "}  cubes = %d\n", Min_CoverCountCubes( pCover ) );
    }
    // process the fanins
    Vec_IntForEachEntry( vSupp, Entry, i )
    {
        pFanin = Abc_NtkObj(pObj->pNtk, Entry);
        Abc_NtkCovDerive_rec( p, pNtkNew, pFanin );
    }
    // for each cube, construct the node
    nCubes = Min_CoverCountCubes( pCover );
    if ( nCubes == 0 )
        pNodeNew = Abc_NtkCreateNodeConst0(pNtkNew);
    else if ( nCubes == 1 )
        pNodeNew = Abc_NtkCovDeriveCube( pNtkNew, pObj, pCover, vSupp, Type == '0' );
    else
    {
        // create the node
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        Vec_IntForEachEntry( vSupp, Entry, i )
        {
            pFanin = Abc_NtkObj(pObj->pNtk, Entry);
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        }
        // derive the function
        vCover = Vec_StrAlloc( 100 );
        Min_CoverCreate( vCover, pCover, (char)Type );
        pNodeNew->pData = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc, Vec_StrArray(vCover) );
        Vec_StrFree( vCover );
    }

/*
    printf( "Created node %d(%d) at level %d: ", pNodeNew->Id, pObj->Id, Level );
    Vec_IntForEachEntry( vSupp, Entry, i )
    {
        pFanin = Abc_NtkObj(pObj->pNtk, Entry);
        printf( "%d(%d) ", pFanin->pCopy->Id, pFanin->Id );
    }
    printf( "\n" );
    Min_CoverWrite( stdout, pCover );
*/
    return pObj->pCopy = pNodeNew;
}